

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O2

Fraig_Node_t * Abc_NtkToFraigExdc(Fraig_Man_t *pMan,Abc_Ntk_t *pNtkMain,Abc_Ntk_t *pNtkExdc)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  Abc_Ntk_t *pNtk;
  Fraig_Node_t *pFVar6;
  Abc_Obj_t *pAVar7;
  char **__ptr;
  char *pcVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = 0;
  pNtk = Abc_NtkStrash(pNtkExdc,0,0,0);
  Abc_NtkCleanCopy(pNtk);
  pFVar6 = Fraig_ManReadConst1(pMan);
  pAVar7 = Abc_AigConst1(pNtk);
  (pAVar7->field_6).pCopy = (Abc_Obj_t *)pFVar6;
  __ptr = Abc_NtkCollectCioNames(pNtkMain,0);
  while (iVar9 < pNtk->vCis->nSize) {
    pAVar7 = Abc_NtkCi(pNtk,iVar9);
    for (lVar10 = 0; lVar10 < pNtkMain->vCis->nSize; lVar10 = lVar10 + 1) {
      pcVar8 = Abc_ObjName(pAVar7);
      iVar5 = strcmp(pcVar8,__ptr[lVar10]);
      if (iVar5 == 0) {
        pFVar6 = Fraig_ManReadIthVar(pMan,(int)lVar10);
        (pAVar7->field_6).pCopy = (Abc_Obj_t *)pFVar6;
        goto LAB_0023a400;
      }
    }
    pFVar6 = (Fraig_Node_t *)(pAVar7->field_6).pTemp;
LAB_0023a400:
    iVar9 = iVar9 + 1;
    if (pFVar6 == (Fraig_Node_t *)0x0) {
      __assert_fail("pObj->pCopy != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                    ,0xb9,
                    "Fraig_Node_t *Abc_NtkToFraigExdc(Fraig_Man_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
    }
  }
  free(__ptr);
  iVar9 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar9) {
      pAVar7 = Abc_NtkPo(pNtk,0);
      uVar1 = *(uint *)&pAVar7->field_0x14;
      uVar4 = *(ulong *)((long)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray] + 0x40);
      Abc_NtkDelete(pNtk);
      return (Fraig_Node_t *)(uVar1 >> 10 & 1 ^ uVar4);
    }
    pAVar7 = Abc_NtkObj(pNtk,iVar9);
    if (pAVar7 != (Abc_Obj_t *)0x0) {
      if (((ulong)pAVar7 & 1) != 0) {
        pcVar8 = "!Abc_ObjIsComplement(pNode)";
LAB_0023a509:
        __assert_fail(pcVar8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if (pAVar7->pNtk->ntkType != ABC_NTK_STRASH) {
        pcVar8 = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_0023a509;
      }
      if ((pAVar7->vFanins).nSize == 2) {
        ppvVar2 = pAVar7->pNtk->vObjs->pArray;
        piVar3 = (pAVar7->vFanins).pArray;
        pFVar6 = Fraig_NodeAnd(pMan,(Fraig_Node_t *)
                                    ((ulong)(*(uint *)&pAVar7->field_0x14 >> 10 & 1) ^
                                    *(ulong *)((long)ppvVar2[*piVar3] + 0x40)),
                               (Fraig_Node_t *)
                               ((ulong)(*(uint *)&pAVar7->field_0x14 >> 0xb & 1) ^
                               *(ulong *)((long)ppvVar2[piVar3[1]] + 0x40)));
        (pAVar7->field_6).pCopy = (Abc_Obj_t *)pFVar6;
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Fraig_Node_t * Abc_NtkToFraigExdc( Fraig_Man_t * pMan, Abc_Ntk_t * pNtkMain, Abc_Ntk_t * pNtkExdc )
{
    Abc_Ntk_t * pNtkStrash;
    Abc_Obj_t * pObj;
    Fraig_Node_t * gResult;
    char ** ppNames;
    int i, k;
    // strash the EXDC network
    pNtkStrash = Abc_NtkStrash( pNtkExdc, 0, 0, 0 );
    Abc_NtkCleanCopy( pNtkStrash );
    Abc_AigConst1(pNtkStrash)->pCopy = (Abc_Obj_t *)Fraig_ManReadConst1(pMan);
    // set the mapping of the PI nodes
    ppNames = Abc_NtkCollectCioNames( pNtkMain, 0 );
    Abc_NtkForEachCi( pNtkStrash, pObj, i )
    {
        for ( k = 0; k < Abc_NtkCiNum(pNtkMain); k++ )
            if ( strcmp( Abc_ObjName(pObj), ppNames[k] ) == 0 )
            {
                pObj->pCopy = (Abc_Obj_t *)Fraig_ManReadIthVar(pMan, k);
                break;
            }
        assert( pObj->pCopy != NULL );
    }
    ABC_FREE( ppNames );
    // build FRAIG for each node
    Abc_AigForEachAnd( pNtkStrash, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Fraig_NodeAnd( pMan, 
                Fraig_NotCond( Abc_ObjFanin0(pObj)->pCopy, (int)Abc_ObjFaninC0(pObj) ),
                Fraig_NotCond( Abc_ObjFanin1(pObj)->pCopy, (int)Abc_ObjFaninC1(pObj) ) );
    // get the EXDC to be returned
    pObj = Abc_NtkPo( pNtkStrash, 0 );
    gResult = Fraig_NotCond( Abc_ObjFanin0(pObj)->pCopy, (int)Abc_ObjFaninC0(pObj) );
    Abc_NtkDelete( pNtkStrash );
    return gResult;
}